

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Color * LoadImageColors(Image image)

{
  uchar uVar1;
  ushort uVar2;
  undefined2 uVar3;
  Color *pCVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_0000001c;
  
  if (in_stack_00000014 == 0 || in_stack_00000010 == 0) {
    pCVar4 = (Color *)0x0;
  }
  else {
    uVar6 = in_stack_00000014 * in_stack_00000010;
    pCVar4 = (Color *)malloc((long)(int)uVar6 << 2);
    if (in_stack_0000001c < 0xb) {
      if (in_stack_0000001c - 8U < 3) {
        TraceLog(4,"IMAGE: Pixel format converted from 32bit to 8bit per channel");
      }
      if (0 < (int)uVar6) {
        uVar5 = 0;
        iVar7 = 0;
        do {
          switch(in_stack_0000001c) {
          case 1:
            uVar1 = *(uchar *)(in_stack_00000008 + uVar5);
            pCVar4[uVar5].r = uVar1;
            pCVar4[uVar5].g = uVar1;
            pCVar4[uVar5].b = uVar1;
            goto LAB_0013d9b7;
          case 2:
            uVar1 = *(uchar *)(in_stack_00000008 + iVar7);
            pCVar4[uVar5].r = uVar1;
            pCVar4[uVar5].g = uVar1;
            pCVar4[uVar5].b = uVar1;
            pCVar4[uVar5].a = *(uchar *)(in_stack_00000008 + 1 + (long)iVar7);
            iVar7 = iVar7 + 2;
            break;
          case 3:
            uVar2 = *(ushort *)(in_stack_00000008 + uVar5 * 2);
            pCVar4[uVar5].r = (byte)(uVar2 >> 8) & 0xf8;
            pCVar4[uVar5].g = (byte)(uVar2 >> 3) & 0xfc;
            pCVar4[uVar5].b = (char)uVar2 << 3;
            goto LAB_0013d9b7;
          case 4:
            lVar8 = (long)iVar7;
            pCVar4[uVar5].r = *(uchar *)(in_stack_00000008 + lVar8);
            pCVar4[uVar5].g = *(uchar *)(in_stack_00000008 + 1 + lVar8);
            pCVar4[uVar5].b = *(uchar *)(in_stack_00000008 + 2 + lVar8);
            goto LAB_0013dac1;
          case 5:
            uVar2 = *(ushort *)(in_stack_00000008 + uVar5 * 2);
            pCVar4[uVar5].r = (byte)(uVar2 >> 8) & 0xf8;
            pCVar4[uVar5].g = (byte)(uVar2 >> 3) & 0xf8;
            pCVar4[uVar5].b = (byte)uVar2 * '\x04' & 0xf8;
            pCVar4[uVar5].a = -((byte)uVar2 & 1);
            break;
          case 6:
            uVar3 = *(undefined2 *)(in_stack_00000008 + uVar5 * 2);
            bVar9 = (byte)((ushort)uVar3 >> 8);
            pCVar4[uVar5].r = bVar9 & 0xf0 | bVar9 >> 4;
            pCVar4[uVar5].g = (bVar9 & 0xf) * '\x11';
            bVar9 = (byte)uVar3;
            pCVar4[uVar5].b = (bVar9 >> 4) * '\x11';
            pCVar4[uVar5].a = (bVar9 & 0xf) * '\x11';
            break;
          case 7:
            lVar8 = (long)iVar7;
            pCVar4[uVar5].r = *(uchar *)(in_stack_00000008 + lVar8);
            pCVar4[uVar5].g = *(uchar *)(in_stack_00000008 + 1 + lVar8);
            pCVar4[uVar5].b = *(uchar *)(in_stack_00000008 + 2 + lVar8);
            pCVar4[uVar5].a = *(uchar *)(in_stack_00000008 + 3 + lVar8);
            iVar7 = iVar7 + 4;
            break;
          case 8:
            pCVar4[uVar5].r = (uchar)(int)(*(float *)(in_stack_00000008 + (long)iVar7 * 4) * 255.0);
            pCVar4[uVar5].g = '\0';
            pCVar4[uVar5].b = '\0';
LAB_0013d9b7:
            pCVar4[uVar5].a = 0xff;
            break;
          case 9:
            lVar8 = (long)iVar7;
            pCVar4[uVar5].r = (uchar)(int)(*(float *)(in_stack_00000008 + lVar8 * 4) * 255.0);
            pCVar4[uVar5].g = (uchar)(int)(*(float *)(in_stack_00000008 + 4 + lVar8 * 4) * 255.0);
            pCVar4[uVar5].b = (uchar)(int)(*(float *)(in_stack_00000008 + 8 + lVar8 * 4) * 255.0);
LAB_0013dac1:
            pCVar4[uVar5].a = 0xff;
            iVar7 = iVar7 + 3;
            break;
          case 10:
            lVar8 = (long)iVar7;
            iVar7 = iVar7 + 4;
            pCVar4[uVar5] =
                 (Color)(((int)(*(float *)(in_stack_00000008 + lVar8 * 4) * 255.0) & 0xffU) *
                        0x1010101);
          }
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
    }
    else {
      TraceLog(4,"IMAGE: Pixel data retrieval not supported for compressed image formats");
    }
  }
  return pCVar4;
}

Assistant:

Color *LoadImageColors(Image image)
{
    if ((image.width == 0) || (image.height == 0)) return NULL;

    Color *pixels = (Color *)RL_MALLOC(image.width*image.height*sizeof(Color));

    if (image.format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "IMAGE: Pixel data retrieval not supported for compressed image formats");
    else
    {
        if ((image.format == PIXELFORMAT_UNCOMPRESSED_R32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32A32)) TRACELOG(LOG_WARNING, "IMAGE: Pixel format converted from 32bit to 8bit per channel");

        for (int i = 0, k = 0; i < image.width*image.height; i++)
        {
            switch (image.format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    pixels[i].r = ((unsigned char *)image.data)[i];
                    pixels[i].g = ((unsigned char *)image.data)[i];
                    pixels[i].b = ((unsigned char *)image.data)[i];
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k];
                    pixels[i].b = ((unsigned char *)image.data)[k];
                    pixels[i].a = ((unsigned char *)image.data)[k + 1];

                    k += 2;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111000000) >> 6)*(255/31));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000000111110) >> 1)*(255/31));
                    pixels[i].a = (unsigned char)((pixel & 0b0000000000000001)*255);

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111100000) >> 5)*(255/63));
                    pixels[i].b = (unsigned char)((float)(pixel & 0b0000000000011111)*(255/31));
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111000000000000) >> 12)*(255/15));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000111100000000) >> 8)*(255/15));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000011110000) >> 4)*(255/15));
                    pixels[i].a = (unsigned char)((float)(pixel & 0b0000000000001111)*(255/15));

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k + 1];
                    pixels[i].b = ((unsigned char *)image.data)[k + 2];
                    pixels[i].a = ((unsigned char *)image.data)[k + 3];

                    k += 4;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    pixels[i].r = (unsigned char)((unsigned char *)image.data)[k];
                    pixels[i].g = (unsigned char)((unsigned char *)image.data)[k + 1];
                    pixels[i].b = (unsigned char)((unsigned char *)image.data)[k + 2];
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = 0;
                    pixels[i].b = 0;
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k + 1]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k + 2]*255.0f);
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].a = (unsigned char)(((float *)image.data)[k]*255.0f);

                    k += 4;
                } break;
                default: break;
            }
        }
    }

    return pixels;
}